

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O3

void __thiscall MPEGSequenceHeader::setFrameRate(MPEGSequenceHeader *this,uint8_t *buff,double fps)

{
  long lVar1;
  ostream *poVar2;
  undefined4 *puVar3;
  ostringstream ss;
  undefined1 *local_1b8;
  undefined8 local_1b0;
  undefined1 local_1a8;
  undefined7 uStack_1a7;
  undefined8 uStack_1a0;
  double local_198;
  ostringstream local_190 [376];
  
  lVar1 = 1;
  do {
    if (ABS(frame_rates[lVar1] - fps) < 3e-05) {
      this->frame_rate_index = (uint8_t)lVar1;
      buff[3] = (uint8_t)lVar1 + (buff[3] & 0xf0);
      return;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 9);
  local_198 = fps;
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Can\'t set fps to value ",0x17);
  poVar2 = std::ostream::_M_insert<double>(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,". Only standard fps values allowed for mpeg2 streams.",0x35);
  puVar3 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar3 = 0x15e;
  *(undefined4 **)(puVar3 + 2) = puVar3 + 6;
  if (local_1b8 == &local_1a8) {
    *(ulong *)(puVar3 + 6) = CONCAT71(uStack_1a7,local_1a8);
    *(undefined8 *)(puVar3 + 8) = uStack_1a0;
  }
  else {
    *(undefined1 **)(puVar3 + 2) = local_1b8;
    *(ulong *)(puVar3 + 6) = CONCAT71(uStack_1a7,local_1a8);
  }
  *(undefined8 *)(puVar3 + 4) = local_1b0;
  local_1a8 = 0;
  __cxa_throw(puVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

void MPEGSequenceHeader::setFrameRate(uint8_t* buff, const double fps)
{
    for (uint8_t i = 1; i < 9; i++)
        if (std::abs(frame_rates[i] - fps) < FRAME_RATE_EPS)
        {
            frame_rate_index = i;
            buff[3] = (buff[3] & 0xf0) + i;
            return;
        }
    THROW(ERR_MPEG2_ERR_FPS,
          "Can't set fps to value " << fps << ". Only standard fps values allowed for mpeg2 streams.")
}